

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ProdItem * __thiscall
slang::BumpAllocator::
emplace<slang::ast::RandSeqProductionSymbol::ProdItem,slang::ast::RandSeqProductionSymbol::ProdItem>
          (BumpAllocator *this,ProdItem *args)

{
  ProdItem *pPVar1;
  undefined8 *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pPVar1 = (ProdItem *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  *(undefined8 *)pPVar1 = *in_RSI;
  pPVar1->target = (RandSeqProductionSymbol *)in_RSI[1];
  (pPVar1->args)._M_ptr = (pointer)in_RSI[2];
  (pPVar1->args)._M_extent._M_extent_value = in_RSI[3];
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }